

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::ConstantVector::Reference(Vector *vector,Vector *source,idx_t position,idx_t count)

{
  LogicalType *other;
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  undefined8 uVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  idx_t iVar7;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar8;
  type vector_00;
  type source_00;
  idx_t iVar9;
  idx_t i_1;
  ulong __n;
  SelectionVector sel;
  Value value;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  other = &source->type;
  PVar1 = (source->type).physical_type_;
  if (PVar1 == ARRAY) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&value);
    Vector::ToUnifiedFormat(source,count,(UnifiedVectorFormat *)&value);
    if (*(long *)value.type_._0_8_ != 0) {
      position = (idx_t)*(uint *)(*(long *)value.type_._0_8_ + position * 4);
    }
    if ((value.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (((ulong)(&(value.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi)->_vptr__Sp_counted_base)[position >> 6] >> (position & 0x3f) & 1) != 0)) {
      pVVar5 = ArrayVector::GetEntryInternal<duckdb::Vector>(vector);
      pVVar6 = ArrayVector::GetEntryInternal<duckdb::Vector>(source);
      Vector::Reference(pVVar5,pVVar6);
      iVar7 = ArrayType::GetSize(other);
      SelectionVector::SelectionVector(&sel,iVar7);
      for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
        sel.sel_vector[iVar9] = (int)position * (int)iVar7 + (int)iVar9;
      }
      Vector::Slice(pVVar5,&sel,iVar7);
      Vector::Flatten(pVVar5,iVar7);
      Vector::SetVectorType(vector,CONSTANT_VECTOR);
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 != (unsigned_long *)0x0) {
        *(byte *)puVar3 = (byte)*puVar3 | 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      goto LAB_012bebd2;
    }
    LogicalType::LogicalType(&local_60,other);
    Value::Value((Value *)&sel,&local_60);
    LogicalType::~LogicalType(&local_60);
    Vector::Reference(vector,(Value *)&sel);
  }
  else if (PVar1 == STRUCT) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&value);
    Vector::ToUnifiedFormat(source,count,(UnifiedVectorFormat *)&value);
    iVar7 = position;
    if (*(long *)value.type_._0_8_ != 0) {
      iVar7 = (idx_t)*(uint *)(*(long *)value.type_._0_8_ + position * 4);
    }
    if ((value.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (((ulong)(&(value.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi)->_vptr__Sp_counted_base)[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
      this = StructVector::GetEntries(source);
      this_00 = StructVector::GetEntries(vector);
      for (__n = 0; __n < (ulong)((long)(this->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(this_00,__n);
        vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar8);
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(this,__n);
        source_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar8);
        Reference(vector_00,source_00,position,count);
      }
      Vector::SetVectorType(vector,CONSTANT_VECTOR);
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 != (unsigned_long *)0x0) {
        *(byte *)puVar3 = (byte)*puVar3 | 1;
      }
      goto LAB_012bebd2;
    }
    LogicalType::LogicalType(&local_78,other);
    Value::Value((Value *)&sel,&local_78);
    LogicalType::~LogicalType(&local_78);
    Vector::Reference(vector,(Value *)&sel);
  }
  else {
    if (PVar1 != LIST) {
      Vector::GetValue(&value,source,position);
      Vector::Reference(vector,&value);
      Value::~Value(&value);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&value);
    Vector::ToUnifiedFormat(source,count,(UnifiedVectorFormat *)&value);
    if (*(long *)value.type_._0_8_ != 0) {
      position = (idx_t)*(uint *)(*(long *)value.type_._0_8_ + position * 4);
    }
    if ((value.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (((ulong)(&(value.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi)->_vptr__Sp_counted_base)[position >> 6] >> (position & 0x3f) & 1) != 0)) {
      pdVar2 = vector->data;
      uVar4 = (&(value.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ExtraTypeInfo + position * 2)[1];
      *(_func_int ***)pdVar2 =
           (&(value.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ExtraTypeInfo)[position * 2];
      *(undefined8 *)(pdVar2 + 8) = uVar4;
      pVVar5 = ListVector::GetEntryInternal<duckdb::Vector>(vector);
      pVVar6 = ListVector::GetEntryInternal<duckdb::Vector>(source);
      Vector::Reference(pVVar5,pVVar6);
      iVar7 = ListVector::GetListSize(source);
      ListVector::SetListSize(vector,iVar7);
      Vector::SetVectorType(vector,CONSTANT_VECTOR);
      goto LAB_012bebd2;
    }
    LogicalType::LogicalType(&local_48,other);
    Value::Value((Value *)&sel,&local_48);
    LogicalType::~LogicalType(&local_48);
    Vector::Reference(vector,(Value *)&sel);
  }
  Value::~Value((Value *)&sel);
LAB_012bebd2:
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&value);
  return;
}

Assistant:

void ConstantVector::Reference(Vector &vector, Vector &source, idx_t position, idx_t count) {
	auto &source_type = source.GetType();
	switch (source_type.InternalType()) {
	case PhysicalType::LIST: {
		// retrieve the list entry from the source vector
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		auto list_index = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(list_index)) {
			// list is null: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vdata);
		auto list_entry = list_data[list_index];

		// add the list entry as the first element of "vector"
		// FIXME: we only need to allocate space for 1 tuple here
		auto target_data = FlatVector::GetData<list_entry_t>(vector);
		target_data[0] = list_entry;

		// create a reference to the child list of the source vector
		auto &child = ListVector::GetEntry(vector);
		child.Reference(ListVector::GetEntry(source));

		ListVector::SetListSize(vector, ListVector::GetListSize(source));
		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		break;
	}
	case PhysicalType::ARRAY: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);
		auto source_idx = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(source_idx)) {
			// list is null: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		// Reference the child vector
		auto &target_child = ArrayVector::GetEntry(vector);
		auto &source_child = ArrayVector::GetEntry(source);
		target_child.Reference(source_child);

		// Only take the element at the given position
		auto array_size = ArrayType::GetSize(source_type);
		SelectionVector sel(array_size);
		for (idx_t i = 0; i < array_size; i++) {
			sel.set_index(i, array_size * source_idx + i);
		}
		target_child.Slice(sel, array_size);
		target_child.Flatten(array_size); // since its constant we only have to flatten this much

		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		vector.validity.Set(0, true);
		break;
	}
	case PhysicalType::STRUCT: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		auto struct_index = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(struct_index)) {
			// null struct: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		// struct: pass constant reference into child entries
		auto &source_entries = StructVector::GetEntries(source);
		auto &target_entries = StructVector::GetEntries(vector);
		for (idx_t i = 0; i < source_entries.size(); i++) {
			ConstantVector::Reference(*target_entries[i], *source_entries[i], position, count);
		}
		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		vector.validity.Set(0, true);
		break;
	}
	default:
		// default behavior: get a value from the vector and reference it
		// this is not that expensive for scalar types
		auto value = source.GetValue(position);
		vector.Reference(value);
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
		break;
	}
}